

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Test.cpp
# Opt level: O3

Test * __thiscall CppUnit::Test::findTest(Test *this,string *testName)

{
  bool bVar1;
  Test *pTVar2;
  invalid_argument *this_00;
  long *plVar3;
  size_type *psVar4;
  long *plVar5;
  undefined1 local_128 [8];
  TestPath path;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b0;
  long *local_90;
  long local_88;
  long local_80;
  long lStack_78;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  TestPath::TestPath((TestPath *)local_128);
  (*this->_vptr_Test[7])(this,testName,(TestPath *)local_128);
  bVar1 = TestPath::isValid((TestPath *)local_128);
  if (bVar1) {
    pTVar2 = TestPath::getChildTest((TestPath *)local_128);
    TestPath::~TestPath((TestPath *)local_128);
    return pTVar2;
  }
  this_00 = (invalid_argument *)__cxa_allocate_exception(0x10);
  std::operator+(&local_70,"No test named <",testName);
  plVar3 = (long *)std::__cxx11::string::append((char *)&local_70);
  local_50._M_dataplus._M_p = (pointer)*plVar3;
  psVar4 = (size_type *)(plVar3 + 2);
  if ((size_type *)local_50._M_dataplus._M_p == psVar4) {
    local_50.field_2._M_allocated_capacity = *psVar4;
    local_50.field_2._8_4_ = (undefined4)plVar3[3];
    local_50.field_2._12_4_ = *(undefined4 *)((long)plVar3 + 0x1c);
    local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
  }
  else {
    local_50.field_2._M_allocated_capacity = *psVar4;
  }
  local_50._M_string_length = plVar3[1];
  *plVar3 = (long)psVar4;
  plVar3[1] = 0;
  *(undefined1 *)(plVar3 + 2) = 0;
  (*this->_vptr_Test[6])(&local_b0,this);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 &path.m_tests.super__Deque_base<CppUnit::Test_*,_std::allocator<CppUnit::Test_*>_>.
                  _M_impl.super__Deque_impl_data._M_finish._M_node,&local_50,&local_b0);
  plVar3 = (long *)std::__cxx11::string::append
                             ((char *)&path.m_tests.
                                       super__Deque_base<CppUnit::Test_*,_std::allocator<CppUnit::Test_*>_>
                                       ._M_impl.super__Deque_impl_data._M_finish._M_node);
  local_90 = (long *)*plVar3;
  plVar5 = plVar3 + 2;
  if (local_90 == plVar5) {
    local_80 = *plVar5;
    lStack_78 = plVar3[3];
    local_90 = &local_80;
  }
  else {
    local_80 = *plVar5;
  }
  local_88 = plVar3[1];
  *plVar3 = (long)plVar5;
  plVar3[1] = 0;
  *(undefined1 *)(plVar3 + 2) = 0;
  std::invalid_argument::invalid_argument(this_00,(string *)&local_90);
  __cxa_throw(this_00,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument);
}

Assistant:

Test *
Test::findTest( const std::string &testName ) const
{
  TestPath path;
  Test *mutableThis = CPPUNIT_CONST_CAST( Test *, this );
  mutableThis->findTestPath( testName, path );
  if ( !path.isValid() )
    throw std::invalid_argument( "No test named <" + testName + "> found in test <"
                                 + getName() + ">." );
  return path.getChildTest();
}